

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool __thiscall
ON_Extrusion::Evaluate
          (ON_Extrusion *this,double u,double v,int num_der,int array_stride,double *der_array,
          int quadrant,int *hint)

{
  ON_Line *this_00;
  ON_Curve *pOVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dVector T_00;
  ON_3dVector T_01;
  bool bVar4;
  int iVar5;
  double *pdVar6;
  ON_Xform *this_01;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  double *__src;
  ON_Xform *pOVar11;
  ON_Xform *pOVar12;
  ON_3dVector *pOVar13;
  int iVar14;
  ulong uVar15;
  byte bVar16;
  undefined4 uVar17;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  ON_3dVector T;
  ON_Xform xform0;
  ON_Xform xform1;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  double dVar18;
  
  bVar16 = 0;
  pOVar1 = this->m_profile;
  if (pOVar1 == (ON_Curve *)0x0) {
    return false;
  }
  uVar15 = 1;
  dVar18 = u;
  if (this->m_bTransposed == true) {
    dVar18 = v;
    u = u;
    if (quadrant != 2) {
      v = u;
      uVar7 = 2;
      if (quadrant != 4) goto LAB_003f5ef4;
      goto LAB_003f5f04;
    }
  }
  else {
LAB_003f5ef4:
    uVar17 = SUB84(dVar18,0);
    if ((quadrant == 1) || (uVar7 = quadrant, u = v, quadrant == 4)) goto LAB_003f5f18;
LAB_003f5f04:
    uVar15 = (ulong)-(uint)((uVar7 & 0xfffffffe) == 2);
  }
  v = u;
  uVar17 = SUB84(dVar18,0);
LAB_003f5f18:
  iVar5 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3b])
                    (uVar17,pOVar1,(ulong)(uint)num_der,(ulong)(uint)array_stride,der_array,uVar15);
  if ((char)iVar5 == '\0') {
    return false;
  }
  dVar18 = ON_Interval::NormalizedParameterAt(&this->m_path_domain,v);
  dVar19 = 1.0 - dVar18;
  this_01 = &xform0;
  ON_Xform::ON_Xform(this_01);
  ON_Xform::ON_Xform(&xform1);
  this_00 = &this->m_path;
  ON_Line::Tangent(&T,this_00);
  if (((0 < num_der) || (dVar19 != 0.0)) || (NAN(dVar19))) {
    ON_Line::PointAt(&local_48,this_00,(this->m_t).m_t[0]);
    pOVar13 = this->m_N;
    if (this->m_bHaveN[0] == false) {
      pOVar13 = (ON_3dVector *)0x0;
    }
    P.y = local_48.y;
    P.x = local_48.x;
    P.z = local_48.z;
    T_00.y = T.y;
    T_00.x = T.x;
    T_00.z = T.z;
    bVar4 = ON_GetEndCapTransformation
                      (P,T_00,this->m_up,pOVar13,&xform0,(ON_Xform *)0x0,(ON_Xform *)0x0);
    if (!bVar4) {
      return false;
    }
  }
  else {
    pOVar11 = &ON_Xform::Zero4x4;
    pOVar12 = &xform0;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar12->m_xform[0][0] = pOVar11->m_xform[0][0];
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
    }
  }
  if (((0 < num_der) || (dVar18 != 0.0)) || (NAN(dVar18))) {
    ON_Line::PointAt(&local_60,this_00,(this->m_t).m_t[1]);
    pOVar13 = this->m_N + 1;
    if (this->m_bHaveN[1] == false) {
      pOVar13 = (ON_3dVector *)0x0;
    }
    P_00.y = local_60.y;
    P_00.x = local_60.x;
    P_00.z = local_60.z;
    T_01.y = T.y;
    T_01.x = T.x;
    T_01.z = T.z;
    bVar4 = ON_GetEndCapTransformation
                      (P_00,T_01,this->m_up,pOVar13,&xform1,(ON_Xform *)0x0,(ON_Xform *)0x0);
    if (!bVar4) {
      return false;
    }
  }
  else {
    pOVar11 = &ON_Xform::Zero4x4;
    pOVar12 = &xform1;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar12->m_xform[0][0] = pOVar11->m_xform[0][0];
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
    }
  }
  dVar20 = xform0.m_xform[0][0] * dVar19 + xform1.m_xform[0][0] * dVar18;
  dVar21 = xform0.m_xform[1][0] * dVar19 + xform1.m_xform[1][0] * dVar18;
  dVar24 = xform0.m_xform[0][1] * dVar19 + xform1.m_xform[0][1] * dVar18;
  dVar26 = xform0.m_xform[1][1] * dVar19 + xform1.m_xform[1][1] * dVar18;
  dVar27 = dVar19 * xform0.m_xform[2][0] + dVar18 * xform1.m_xform[2][0];
  dVar30 = dVar19 * xform0.m_xform[2][1] + dVar18 * xform1.m_xform[2][1];
  pdVar6 = der_array + ((int)((num_der + 2) * (num_der + 1U)) / 2 + -1) * array_stride;
  lVar8 = (long)array_stride;
  dVar31 = der_array[array_stride * num_der];
  dVar32 = (der_array + array_stride * num_der)[1];
  if (0 < num_der) {
    dVar22 = (this->m_path_domain).m_t[1] - (this->m_path_domain).m_t[0];
    dVar22 = (double)(~-(ulong)(0.0 < dVar22) & (ulong)dVar22 |
                     (ulong)(1.0 / dVar22) & -(ulong)(0.0 < dVar22));
    pdVar10 = der_array + array_stride * num_der;
    dVar29 = (xform1.m_xform[2][0] - xform0.m_xform[2][0]) * dVar22;
    dVar25 = (xform1.m_xform[2][1] - xform0.m_xform[2][1]) * dVar22;
    for (iVar5 = num_der; 0 < iVar5; iVar5 = iVar5 + -1) {
      pdVar10 = pdVar10 + -lVar8;
      dVar2 = *pdVar10;
      dVar3 = pdVar10[1];
      for (iVar14 = 1; iVar5 != iVar14; iVar14 = iVar14 + 1) {
        pdVar6[2] = 0.0;
        *pdVar6 = 0.0;
        pdVar6[1] = 0.0;
        pdVar6 = pdVar6 + -lVar8;
      }
      dVar23 = (xform1.m_xform[0][0] - xform0.m_xform[0][0]) * dVar22 * dVar2 +
               dVar3 * (xform1.m_xform[0][1] - xform0.m_xform[0][1]) * dVar22;
      dVar28 = (xform1.m_xform[1][0] - xform0.m_xform[1][0]) * dVar22 * dVar2 +
               (xform1.m_xform[1][1] - xform0.m_xform[1][1]) * dVar22 * dVar3;
      if (iVar5 == 1) {
        dVar23 = dVar23 + dVar22 * (xform1.m_xform[0][3] - xform0.m_xform[0][3]);
        dVar28 = dVar28 + dVar22 * (xform1.m_xform[1][3] - xform0.m_xform[1][3]);
        dVar33 = dVar29 * dVar2 + dVar25 * dVar3 +
                 (xform1.m_xform[2][3] - xform0.m_xform[2][3]) * dVar22;
      }
      else {
        dVar33 = dVar29 * dVar2 + dVar25 * dVar3;
      }
      *pdVar6 = dVar23;
      pdVar6[1] = dVar28;
      pdVar6[2] = dVar33;
      pdVar6[-lVar8] = dVar31 * dVar20 + dVar24 * dVar32;
      (pdVar6 + -lVar8)[1] = dVar31 * dVar21 + dVar26 * dVar32;
      pdVar6[2 - lVar8] = dVar32 * dVar30 + dVar27 * dVar31;
      pdVar6 = pdVar6 + lVar8 * -2;
      dVar31 = dVar2;
      dVar32 = dVar3;
    }
  }
  *pdVar6 = dVar19 * xform0.m_xform[0][3] + dVar18 * xform1.m_xform[0][3] +
            dVar20 * dVar31 + dVar24 * dVar32;
  pdVar6[1] = dVar19 * xform0.m_xform[1][3] + dVar18 * xform1.m_xform[1][3] +
              dVar21 * dVar31 + dVar26 * dVar32;
  pdVar6[2] = dVar19 * xform0.m_xform[2][3] + dVar18 * xform1.m_xform[2][3] +
              dVar30 * dVar32 + dVar27 * dVar31;
  if (0 < num_der) {
    if (this->m_bTransposed != false) {
      iVar5 = 3;
      if (array_stride < 3) {
        iVar5 = array_stride;
      }
      uVar15 = (long)iVar5 << 3;
      if (0x80 < uVar15) {
        this_01 = (ON_Xform *)onmalloc(uVar15);
      }
      pdVar6 = der_array + lVar8;
      uVar9 = 1;
      while (uVar9 != num_der + 1U) {
        iVar5 = ((int)(uVar9 + 1) * (int)uVar9 * array_stride) / 2;
        __src = pdVar6 + iVar5;
        for (pdVar10 = der_array + iVar5; pdVar10 < __src; pdVar10 = pdVar10 + lVar8) {
          memcpy(this_01,pdVar10,uVar15);
          memcpy(pdVar10,__src,uVar15);
          memcpy(__src,this_01,uVar15);
          __src = __src + -lVar8;
        }
        pdVar6 = pdVar6 + lVar8;
        uVar9 = uVar9 + 1;
      }
      if (this_01 != &xform0) {
        onfree(this_01);
      }
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool ON_Extrusion::Evaluate( // returns false if unable to evaluate
       double u, double v,   // evaluation parameters
       int num_der,          // number of derivatives (>=0)
       int array_stride,     // array stride (>=Dimension())
       double* der_array,    // array of length stride*(ndir+1)*(ndir+2)/2
       int quadrant ,     // optional - determines which quadrant to evaluate from
                             //         0 = default
                             //         1 from NE quadrant
                             //         2 from NW quadrant
                             //         3 from SW quadrant
                             //         4 from SE quadrant
       int* hint          // optional - evaluation hint (int[2]) used to speed
                             //            repeated evaluations
       ) const 
{
  if ( !m_profile )
    return false;

  double x,y,dx,dy;
  //int side = 0;
  if ( m_bTransposed ) 
  {
    x = u; u = v; v = x;
    if ( 4 == quadrant )
      quadrant = 2;
    else if ( 2 == quadrant )
      quadrant = 4;
  }

  if ( !m_profile->Evaluate( u, num_der, array_stride, der_array,
                             (1==quadrant||4==quadrant)?1:((2==quadrant||3==quadrant)?-1:0),
                               hint) 
     )
  {
    return false;
  }

  // TODO: After testing, add special case that avoids
  //       two calls to GetProfileTransformation() when 
  //       mitering is trivial.
  const double t1 = m_path_domain.NormalizedParameterAt(v);
  const double t0 = 1.0-t1;
  ON_Xform xform0, xform1;
  const ON_3dVector T = m_path.Tangent();

  if ( 0.0 != t0 || num_der > 0 )
  {
    if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[0]),T,m_up,m_bHaveN[0]?&m_N[0]:0,xform0,0,0) )
      return false;
  }
  else
  {
    xform0 = ON_Xform::Zero4x4;
  }

  if ( 0.0 != t1 || num_der > 0 )
  {
    if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[1]),T,m_up,m_bHaveN[1]?&m_N[1]:0,xform1,0,0) )
      return false;
  }
  else
  {
    xform1 = ON_Xform::Zero4x4;
  }

  double xformP[3][3], xformD[3][3];
  xformP[0][0] = t0*xform0.m_xform[0][0] + t1*xform1.m_xform[0][0];
  xformP[0][1] = t0*xform0.m_xform[0][1] + t1*xform1.m_xform[0][1];
  xformP[0][2] = t0*xform0.m_xform[0][3] + t1*xform1.m_xform[0][3];
  xformP[1][0] = t0*xform0.m_xform[1][0] + t1*xform1.m_xform[1][0];
  xformP[1][1] = t0*xform0.m_xform[1][1] + t1*xform1.m_xform[1][1];
  xformP[1][2] = t0*xform0.m_xform[1][3] + t1*xform1.m_xform[1][3];
  xformP[2][0] = t0*xform0.m_xform[2][0] + t1*xform1.m_xform[2][0];
  xformP[2][1] = t0*xform0.m_xform[2][1] + t1*xform1.m_xform[2][1];
  xformP[2][2] = t0*xform0.m_xform[2][3] + t1*xform1.m_xform[2][3];

  int i,j;
  i = num_der+1;
  double* d1 = der_array + array_stride*(i*(i+1)/2 - 1);
  double* d0 = der_array + array_stride*(i - 1);
  x = d0[0];
  y = d0[1];
  if ( num_der > 0 )
  {
    double d = m_path_domain.m_t[1] - m_path_domain.m_t[0];
    if ( d > 0.0 )
      d = 1.0/d;
    xformD[0][0] = d*(xform1.m_xform[0][0] - xform0.m_xform[0][0]);
    xformD[0][1] = d*(xform1.m_xform[0][1] - xform0.m_xform[0][1]);
    xformD[0][2] = d*(xform1.m_xform[0][3] - xform0.m_xform[0][3]);
    xformD[1][0] = d*(xform1.m_xform[1][0] - xform0.m_xform[1][0]);
    xformD[1][1] = d*(xform1.m_xform[1][1] - xform0.m_xform[1][1]);
    xformD[1][2] = d*(xform1.m_xform[1][3] - xform0.m_xform[1][3]);
    xformD[2][0] = d*(xform1.m_xform[2][0] - xform0.m_xform[2][0]);
    xformD[2][1] = d*(xform1.m_xform[2][1] - xform0.m_xform[2][1]);
    xformD[2][2] = d*(xform1.m_xform[2][3] - xform0.m_xform[2][3]);

    for ( i = num_der; i > 0; i-- )
    {
      dx = x;
      dy = y;
      d0 -= array_stride;
      x = d0[0];
      y = d0[1];

      // all partials involving two or more derivatives with
      // respect to "v" are zero.
      j = i;
      while ( --j )
      {
        d1[0] = d1[1] = d1[2] = 0.0;
        d1 -= array_stride;
      }    

      // The partial involving a single derivative with respect to "v"
      if ( 1 == i )
      {
        // xformD transform is applied to curve location ((x,y) = point)
        d1[0] = xformD[0][0]*x + xformD[0][1]*y + xformD[0][2];
        d1[1] = xformD[1][0]*x + xformD[1][1]*y + xformD[1][2];
        d1[2] = xformD[2][0]*x + xformD[2][1]*y + xformD[2][2];
      }
      else
      {
        // xformD transform is applied to a curve derivative ((x,y) = vector)
        d1[0] = xformD[0][0]*x + xformD[0][1]*y;
        d1[1] = xformD[1][0]*x + xformD[1][1]*y;
        d1[2] = xformD[2][0]*x + xformD[2][1]*y;
      }
      d1 -= array_stride;

      // The partial involving a all derivatives with respect to "u"
      // xformP transformation is applied to a curve derivative ((x,y) = vector)
      d1[0] = xformP[0][0]*dx + xformP[0][1]*dy;
      d1[1] = xformP[1][0]*dx + xformP[1][1]*dy;
      d1[2] = xformP[2][0]*dx + xformP[2][1]*dy;
      d1 -= array_stride;
    }
  }
  // xformP transformation is applied curve location ((x,y) = point)
  d1[0] = xformP[0][0]*x + xformP[0][1]*y + xformP[0][2];
  d1[1] = xformP[1][0]*x + xformP[1][1]*y + xformP[1][2];
  d1[2] = xformP[2][0]*x + xformP[2][1]*y + xformP[2][2];

  if ( m_bTransposed && num_der > 0)
  {
    // reverse order of derivatives
    const size_t sz = ((3 <= array_stride)?3:array_stride)*sizeof(double);
    void* tmp = ( sz <= sizeof(xform0) )
              ? ((void*)&xform0.m_xform[0][0])
              : onmalloc(sz);
    for ( i = 1; i <= num_der; i++ )
    {
      d0 = der_array + array_stride*(i*(i+1))/2;
      d1 = d0 + array_stride*i;
      while ( d0 < d1)
      {
        memcpy(tmp,d0,sz);
        memcpy(d0,d1,sz);
        memcpy(d1,tmp,sz);
        d0 += array_stride;
        d1 -= array_stride;
      }
    }
    if ( tmp != ((void*)&xform0.m_xform[0][0]) )
      onfree(tmp);
  }

  return true;
}